

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

QRgbaFloat<float> *
qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>,QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  Type fill;
  bool bVar2;
  double *pdVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  QRgbaFloat<float> *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  qreal qVar11;
  Type TVar12;
  qreal s;
  qreal detSqrt;
  qreal det_1;
  qreal b_1;
  qreal gy;
  qreal gx;
  qreal invRw;
  qreal rw;
  qreal delta_delta_det;
  qreal delta_det;
  qreal det;
  qreal delta_rx_plus_ry;
  qreal rx_plus_ry;
  qreal delta_rxrxryry;
  qreal rxrxryry;
  qreal delta_bb;
  qreal bb;
  qreal delta_b_delta_b;
  qreal b_delta_b;
  qreal delta_b;
  qreal b;
  qreal delta_ry;
  qreal delta_rx;
  qreal inv_a;
  QRgbaFloat<float> *end;
  bool affine;
  qreal ry;
  qreal rx;
  QRgbaFloat<float> *beginOfBuffer;
  qreal s1;
  qreal s0;
  QRgbaFloat<float> result;
  QGradientData *in_stack_fffffffffffffe58;
  int length_00;
  Type *in_stack_fffffffffffffe60;
  QRgbaFloat<float> *pQVar13;
  undefined7 in_stack_fffffffffffffe68;
  byte bVar14;
  qreal in_stack_fffffffffffffe70;
  qreal in_stack_fffffffffffffe78;
  qreal in_stack_fffffffffffffe80;
  qreal in_stack_fffffffffffffe88;
  QSpanData *in_stack_fffffffffffffe90;
  Operator *in_stack_fffffffffffffe98;
  BlendType *in_stack_fffffffffffffea0;
  BlendType *in_stack_fffffffffffffea8;
  double local_150;
  double local_a0;
  double local_98;
  QRgbaFloat<float> *local_58;
  double local_38;
  double local_30;
  Type local_28;
  Type local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = qFuzzyIsNull((double)in_stack_fffffffffffffe58);
  if (bVar2) {
    pQVar13 = in_RDI;
    GradientBaseFP::null();
    TVar12._8_8_ = in_stack_fffffffffffffe78;
    TVar12._0_8_ = pQVar13;
    GradientBaseFP::memfill
              (in_stack_fffffffffffffe60,TVar12,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  }
  else {
    local_98 = *(double *)(in_RDX + 0x38) * ((double)in_R8D + 0.5) +
               *(double *)(in_RDX + 0x50) * ((double)in_ECX + 0.5) + *(double *)(in_RDX + 0x70);
    local_a0 = *(double *)(in_RDX + 0x40) * ((double)in_R8D + 0.5) +
               *(double *)(in_RDX + 0x58) * ((double)in_ECX + 0.5) + *(double *)(in_RDX + 0x78);
    bVar14 = 0;
    if ((*(double *)(in_RDX + 0x48) == 0.0) && (!NAN(*(double *)(in_RDX + 0x48)))) {
      bVar14 = *(double *)(in_RDX + 0x60) != 0.0 ^ 0xff;
    }
    dVar4 = 1.0 / (*(double *)(in_RSI + 0xa0) * 2.0);
    if ((bVar14 & 1) == 0) {
      local_150 = *(double *)(in_RDX + 0x48) * ((double)in_R8D + 0.5) +
                  *(double *)(in_RDX + 0x60) * ((double)in_ECX + 0.5) + *(double *)(in_RDX + 0x68);
      for (local_58 = in_RDI; local_58 < in_RDI + in_R9D; local_58 = local_58 + 1) {
        if ((local_150 != 0.0) || (NAN(local_150))) {
          dVar8 = local_98 * (1.0 / local_150) - *(double *)(in_RDX + 200);
          dVar9 = local_a0 * (1.0 / local_150) - *(double *)(in_RDX + 0xd0);
          dVar10 = dVar9 * *(double *)(in_RSI + 0x88) +
                   *(double *)(in_RSI + 0x90) * *(double *)(in_RDX + 0xd8) +
                   dVar8 * *(double *)(in_RSI + 0x80);
          dVar10 = dVar10 + dVar10;
          qVar11 = qRadialDeterminant(*(qreal *)(in_RSI + 0xa0),dVar10,
                                      *(double *)(in_RSI + 0x98) - (dVar8 * dVar8 + dVar9 * dVar9));
          local_28.b = -NAN;
          local_28.a = -NAN;
          local_28.r = -NAN;
          local_28.g = -NAN;
          local_28 = GradientBaseFP::null();
          if (0.0 <= qVar11) {
            dVar8 = qSqrt<double>(5.85249561526109e-317);
            local_30 = (-dVar10 - dVar8) * dVar4;
            local_38 = (-dVar10 + dVar8) * dVar4;
            pdVar3 = qMax<double>(&local_30,&local_38);
            if (0.0 <= *(double *)(in_RSI + 0x90) * *pdVar3 + *(double *)(in_RDX + 0xd8)) {
              local_28 = GradientBaseFP::fetchSingle
                                   (in_stack_fffffffffffffe58,5.85260628596576e-317);
            }
          }
          TVar12 = local_28;
          local_58->r = local_28.r;
          local_58->g = local_28.g;
          local_28._8_8_ = TVar12._8_8_;
          local_58->b = local_28.b;
          local_58->a = local_28.a;
          local_28 = TVar12;
        }
        else {
          TVar12 = GradientBaseFP::null();
          local_18._0_8_ = TVar12._0_8_;
          local_58->r = local_18.r;
          local_58->g = local_18.g;
          local_18._8_8_ = TVar12._8_8_;
          local_58->b = local_18.b;
          local_58->a = local_18.a;
          local_18 = TVar12;
        }
        local_98 = *(double *)(in_RDX + 0x38) + local_98;
        local_a0 = *(double *)(in_RDX + 0x40) + local_a0;
        local_150 = *(double *)(in_RDX + 0x48) + local_150;
      }
    }
    else {
      local_98 = local_98 - *(double *)(in_RDX + 200);
      local_a0 = local_a0 - *(double *)(in_RDX + 0xd0);
      dVar8 = *(double *)(in_RDX + 0x38);
      dVar9 = *(double *)(in_RDX + 0x40);
      dVar5 = (local_a0 * *(double *)(in_RSI + 0x88) +
              *(double *)(in_RSI + 0x90) * *(double *)(in_RDX + 0xd8) +
              local_98 * *(double *)(in_RSI + 0x80)) * 2.0;
      dVar6 = (dVar8 * *(double *)(in_RSI + 0x80) + dVar9 * *(double *)(in_RSI + 0x88)) * 2.0;
      dVar7 = dVar8 * dVar8 + dVar9 * dVar9;
      dVar4 = dVar4 * dVar4;
      dVar10 = *(double *)(in_RSI + 0xa0);
      dVar1 = *(double *)(in_RSI + 0xa0);
      bVar2 = std::isfinite((float)((-(*(double *)(in_RSI + 0xa0) * 4.0) *
                                     (*(double *)(in_RSI + 0x98) -
                                     (local_98 * local_98 + local_a0 * local_a0)) + dVar5 * dVar5) *
                                   dVar4));
      length_00 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      if (((bVar2) &&
          (bVar2 = std::isfinite((float)((dVar10 * 4.0 *
                                          ((local_98 * dVar8 + local_a0 * dVar9) * 2.0 + dVar7) +
                                         dVar5 * 2.0 * dVar6 + dVar6 * dVar6) * dVar4)), bVar2)) &&
         (bVar2 = std::isfinite((float)((dVar1 * 4.0 * dVar7 * 2.0 + dVar6 * 2.0 * dVar6) * dVar4)),
         bVar2)) {
        RadialFetchPlain<GradientBaseFP>::fetch
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                   (qreal)CONCAT17(bVar14,in_stack_fffffffffffffe68));
      }
      else {
        pQVar13 = in_RDI;
        GradientBaseFP::null();
        fill._8_8_ = in_stack_fffffffffffffe78;
        fill._0_8_ = in_stack_fffffffffffffe70;
        GradientBaseFP::memfill(pQVar13,fill,length_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static
const BlendType * QT_FASTCALL qt_fetch_radial_gradient_template(BlendType *buffer, const Operator *op,
                                                                const QSpanData *data, int y, int x, int length)
{
    // avoid division by zero
    if (qFuzzyIsNull(op->radial.a)) {
        RadialFetchFunc::memfill(buffer, RadialFetchFunc::null(), length);
        return buffer;
    }

    const BlendType *beginOfBuffer = buffer;
    qreal rx = data->m21 * (y + qreal(0.5))
               + data->dx + data->m11 * (x + qreal(0.5));
    qreal ry = data->m22 * (y + qreal(0.5))
               + data->dy + data->m12 * (x + qreal(0.5));
    bool affine = !data->m13 && !data->m23;

    BlendType *end = buffer + length;
    qreal inv_a = 1 / qreal(2 * op->radial.a);

    if (affine) {
        rx -= data->gradient.radial.focal.x;
        ry -= data->gradient.radial.focal.y;

        const qreal delta_rx = data->m11;
        const qreal delta_ry = data->m12;

        qreal b = 2*(op->radial.dr*data->gradient.radial.focal.radius + rx * op->radial.dx + ry * op->radial.dy);
        qreal delta_b = 2*(delta_rx * op->radial.dx + delta_ry * op->radial.dy);
        const qreal b_delta_b = 2 * b * delta_b;
        const qreal delta_b_delta_b = 2 * delta_b * delta_b;

        const qreal bb = b * b;
        const qreal delta_bb = delta_b * delta_b;

        b *= inv_a;
        delta_b *= inv_a;

        const qreal rxrxryry = rx * rx + ry * ry;
        const qreal delta_rxrxryry = delta_rx * delta_rx + delta_ry * delta_ry;
        const qreal rx_plus_ry = 2*(rx * delta_rx + ry * delta_ry);
        const qreal delta_rx_plus_ry = 2 * delta_rxrxryry;

        inv_a *= inv_a;

        qreal det = (bb - 4 * op->radial.a * (op->radial.sqrfr - rxrxryry)) * inv_a;
        qreal delta_det = (b_delta_b + delta_bb + 4 * op->radial.a * (rx_plus_ry + delta_rxrxryry)) * inv_a;
        const qreal delta_delta_det = (delta_b_delta_b + 4 * op->radial.a * delta_rx_plus_ry) * inv_a;

        if (std::isfinite(float(det)) && std::isfinite(float(delta_det))
            && std::isfinite(float(delta_delta_det)))
            RadialFetchFunc::fetch(buffer, end, op, data, det, delta_det, delta_delta_det, b, delta_b);
        else
            RadialFetchFunc::memfill(buffer, RadialFetchFunc::null(), length);
    } else {
        qreal rw = data->m23 * (y + qreal(0.5))
                   + data->m33 + data->m13 * (x + qreal(0.5));

        while (buffer < end) {
            if (rw == 0) {
                *buffer = RadialFetchFunc::null();
            } else {
                qreal invRw = 1 / rw;
                qreal gx = rx * invRw - data->gradient.radial.focal.x;
                qreal gy = ry * invRw - data->gradient.radial.focal.y;
                qreal b  = 2*(op->radial.dr*data->gradient.radial.focal.radius + gx*op->radial.dx + gy*op->radial.dy);
                qreal det = qRadialDeterminant(op->radial.a, b, op->radial.sqrfr - (gx*gx + gy*gy));

                BlendType result = RadialFetchFunc::null();
                if (det >= 0) {
                    qreal detSqrt = qSqrt(det);

                    qreal s0 = (-b - detSqrt) * inv_a;
                    qreal s1 = (-b + detSqrt) * inv_a;

                    qreal s = qMax(s0, s1);

                    if (data->gradient.radial.focal.radius + op->radial.dr * s >= 0)
                        result = RadialFetchFunc::fetchSingle(data->gradient, s);
                }

                *buffer = result;
            }

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;

            ++buffer;
        }
    }

    return beginOfBuffer;
}